

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O3

void __thiscall btDbvt::clear(btDbvt *this)

{
  sStkNN *ptr;
  
  if (this->m_root != (btDbvtNode *)0x0) {
    recursedeletenode(this,this->m_root);
  }
  btAlignedFreeInternal(this->m_free);
  this->m_free = (btDbvtNode *)0x0;
  this->m_lkhd = -1;
  ptr = (this->m_stkStack).m_data;
  if ((ptr != (sStkNN *)0x0) && ((this->m_stkStack).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr);
  }
  (this->m_stkStack).m_ownsMemory = true;
  (this->m_stkStack).m_data = (sStkNN *)0x0;
  (this->m_stkStack).m_size = 0;
  (this->m_stkStack).m_capacity = 0;
  this->m_opath = 0;
  return;
}

Assistant:

void			btDbvt::clear()
{
	if(m_root)	
		recursedeletenode(this,m_root);
	btAlignedFree(m_free);
	m_free=0;
	m_lkhd		=	-1;
	m_stkStack.clear();
	m_opath		=	0;
	
}